

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_thread.c
# Opt level: O1

void nhr_mutex_unlock(nhr_mutex mutex)

{
  if (mutex == (nhr_mutex)0x0) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  return;
}

Assistant:

void nhr_mutex_unlock(nhr_mutex mutex) {
	if (mutex) {
#if defined(NHR_OS_WINDOWS)
		LeaveCriticalSection((LPCRITICAL_SECTION)mutex);
#else
		pthread_mutex_unlock((pthread_mutex_t *)mutex);
#endif
	}
}